

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testSerializeFromStringNewOrderSingle(int count)

{
  long lVar1;
  pointer pDataDictionary;
  long lVar2;
  int local_43c;
  int i;
  long start;
  string string;
  NewOrderSingle message;
  OrdType ordType;
  TransactTime transactTime;
  Side side;
  STRING local_190;
  undefined1 local_170 [8];
  Symbol symbol;
  undefined1 local_108 [8];
  HandlInst handlInst;
  allocator<char> local_91;
  STRING local_90;
  undefined1 local_70 [8];
  ClOrdID clOrdID;
  int count_local;
  
  clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ORDERID",&local_91);
  FIX::ClOrdID::ClOrdID((ClOrdID *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  symbol.super_StringField.super_FieldBase.m_metrics._15_1_ = 0x31;
  FIX::HandlInst::HandlInst
            ((HandlInst *)local_108,&symbol.super_StringField.super_FieldBase.m_metrics.field_0xf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"LNUX",
             (allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
  FIX::Symbol::Symbol((Symbol *)local_170,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
  FIX::Side::Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum
                  ,"11");
  FIX::TransactTime::TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
  FIX::OrdType::OrdType((OrdType *)&message.super_Message.field_0x150,"1");
  FIX42::NewOrderSingle::NewOrderSingle
            ((NewOrderSingle *)((long)&string.field_2 + 8),(ClOrdID *)local_70,
             (HandlInst *)local_108,(Symbol *)local_170,
             (Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum,
             (TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum,
             (OrdType *)&message.super_Message.field_0x150);
  FIX::Message::toString_abi_cxx11_((int)&start,(int)&string + 0x18,8);
  clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ =
       clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ + -1;
  lVar1 = GetTickCount();
  for (local_43c = 0; local_43c <= (int)clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_;
      local_43c = local_43c + 1) {
    pDataDictionary =
         std::unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>::get
                   (&s_dataDictionary);
    FIX::Message::setString
              ((Message *)(string.field_2._M_local_buf + 8),(string *)&start,false,pDataDictionary);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&start);
  FIX42::NewOrderSingle::~NewOrderSingle((NewOrderSingle *)((long)&string.field_2 + 8));
  FIX::OrdType::~OrdType((OrdType *)&message.super_Message.field_0x150);
  FIX::TransactTime::~TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
  FIX::Side::~Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.
                            m_checksum);
  FIX::Symbol::~Symbol((Symbol *)local_170);
  FIX::HandlInst::~HandlInst((HandlInst *)local_108);
  FIX::ClOrdID::~ClOrdID((ClOrdID *)local_70);
  return lVar2 - lVar1;
}

Assistant:

long testSerializeFromStringNewOrderSingle( int count )
{
  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message
  ( clOrdID, handlInst, symbol, side, transactTime, ordType );
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    message.setString( string, DONT_VALIDATE, s_dataDictionary.get() );
  }
  return GetTickCount() - start;
}